

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

string * __thiscall
testing::internal::FlagToEnvVar_abi_cxx11_(string *__return_storage_ptr__,internal *this,char *flag)

{
  undefined8 uVar1;
  int iVar2;
  pointer pcVar3;
  size_t sVar4;
  ostream *poVar5;
  undefined1 local_60 [8];
  string full_flag;
  Message env_var;
  
  Message::Message((Message *)((long)&full_flag.field_2 + 8));
  uVar1 = full_flag.field_2._8_8_;
  poVar5 = (ostream *)(full_flag.field_2._8_8_ + 0x10);
  sVar4 = 6;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"gtest_",6);
  if (this == (internal *)0x0) {
    this = (internal *)"(null)";
  }
  else {
    sVar4 = strlen((char *)this);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)this,sVar4);
  StringStreamToString((string *)local_60,(stringstream *)uVar1);
  if (uVar1 != 0) {
    (**(code **)(*(long *)uVar1 + 8))(uVar1);
    full_flag.field_2._8_8_ = 0;
  }
  Message::Message((Message *)((long)&full_flag.field_2 + 8));
  if (full_flag._M_dataplus._M_p != (pointer)0x0) {
    poVar5 = (ostream *)(full_flag.field_2._8_8_ + 0x10);
    pcVar3 = (pointer)0x0;
    do {
      iVar2 = toupper((uint)*(byte *)((long)local_60 + (long)pcVar3));
      env_var.ss_.ptr_._7_1_ = (undefined1)iVar2;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,(char *)((long)&env_var.ss_.ptr_ + 7),1);
      pcVar3 = pcVar3 + 1;
    } while (pcVar3 != full_flag._M_dataplus._M_p);
  }
  uVar1 = full_flag.field_2._8_8_;
  StringStreamToString(__return_storage_ptr__,(stringstream *)full_flag.field_2._8_8_);
  if (uVar1 != 0) {
    (**(code **)(*(long *)uVar1 + 8))(uVar1);
    full_flag.field_2._8_8_ = 0;
  }
  if (local_60 != (undefined1  [8])&full_flag._M_string_length) {
    operator_delete((void *)local_60,full_flag._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}